

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::JsonMappingApi::DecodePsbt(string *request_message)

{
  function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)> *in_RSI
  ;
  string *in_RDI;
  function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>
  *in_stack_00000270;
  string *in_stack_00000278;
  
  std::function<void(cfd::api::json::DecodePsbtRequest*,cfd::api::json::DecodePsbtResponse*)>::
  function<void(&)(cfd::api::json::DecodePsbtRequest*,cfd::api::json::DecodePsbtResponse*),void>
            (in_RSI,(_func_void_DecodePsbtRequest_ptr_DecodePsbtResponse_ptr *)in_RDI);
  ExecuteDirectApi<cfd::api::json::DecodePsbtRequest,cfd::api::json::DecodePsbtResponse>
            (in_stack_00000278,in_stack_00000270);
  std::function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>::
  ~function((function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>
             *)0x63f5ab);
  return in_RDI;
}

Assistant:

std::string JsonMappingApi::DecodePsbt(
    const std::string &request_message) {
  return ExecuteDirectApi<DecodePsbtRequest, DecodePsbtResponse>(
      request_message, PsbtJsonApi::DecodePsbt);
}